

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

int secp256k1_fe_is_square_var(secp256k1_fe *x)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  undefined8 uVar10;
  ulong uVar11;
  char *pcVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  char *pcVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long local_148;
  ulong local_118;
  secp256k1_modinv64_signed62 local_110;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_trans2x2 local_b8;
  secp256k1_fe tmp;
  secp256k1_fe sqrt;
  
  tmp.n[0] = x->n[0];
  tmp.n[1] = x->n[1];
  tmp.n[2] = x->n[2];
  tmp.n[3] = x->n[3];
  tmp.n[4] = x->n[4];
  tmp.magnitude = x->magnitude;
  tmp.normalized = x->normalized;
  secp256k1_fe_verify(x);
  sqrt.n[0] = x->n[0];
  sqrt.n[1] = x->n[1];
  sqrt.n[2] = x->n[2];
  sqrt.n[3] = x->n[3];
  sqrt.n[4] = x->n[4];
  sqrt.magnitude = x->magnitude;
  sqrt.normalized = x->normalized;
  secp256k1_fe_normalize_var(&sqrt);
  iVar1 = secp256k1_fe_is_zero(&sqrt);
  if (iVar1 == 0) {
    secp256k1_fe_to_signed62(&local_110,&sqrt);
    f.v[2] = 0;
    f.v[3] = 0;
    f.v[0] = -0x1000003d1;
    f.v[1] = 0;
    f.v[4] = 0x100;
    if ((((local_110.v[0] < 0) || (local_110.v[1] < 0)) || (local_110.v[2] < 0)) ||
       ((local_110.v[3] < 0 || (local_110.v[4] < 0)))) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
      ;
      pcVar19 = 
      "test condition failed: g.v[0] >= 0 && g.v[1] >= 0 && g.v[2] >= 0 && g.v[3] >= 0 && g.v[4] >= 0"
      ;
      uVar10 = 0x2dc;
      goto LAB_00116e6e;
    }
    if (((local_110.v[2] == 0 && local_110.v[3] == 0) &&
        (local_110.v[1] == 0 && local_110.v[0] == 0)) && local_110.v[4] == 0) {
      pcVar12 = 
      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
      ;
      pcVar19 = "test condition failed: (g.v[0] | g.v[1] | g.v[2] | g.v[3] | g.v[4]) != 0";
      uVar10 = 0x2e1;
      goto LAB_00116e6e;
    }
    lVar18 = -1;
    iVar1 = 5;
    uVar23 = 0;
    uVar14 = 0xfffffffefffffc2f;
    for (iVar4 = 0; lVar26 = 1, iVar4 != 0xc; iVar4 = iVar4 + 1) {
      uVar20 = local_110.v[1] << 0x3e | local_110.v[0];
      uVar14 = f.v[1] << 0x3e | uVar14;
      lVar6 = 0;
      iVar22 = 0x3e;
      uVar9 = uVar14;
      uVar15 = uVar20;
      lVar21 = 0;
      local_148 = lVar26;
      while( true ) {
        lVar24 = lVar21;
        local_118 = uVar23;
        uVar3 = secp256k1_ctz64_var(-1L << ((byte)iVar22 & 0x3f) | uVar15);
        lVar18 = lVar18 - (ulong)uVar3;
        bVar7 = (byte)uVar3;
        uVar15 = uVar15 >> (bVar7 & 0x3f);
        local_148 = local_148 << (bVar7 & 0x3f);
        lVar21 = lVar6 << (bVar7 & 0x3f);
        uVar2 = ((uint)(uVar9 >> 1) ^ (uint)(uVar9 >> 2)) & uVar3 ^ (uint)local_118;
        uVar23 = (ulong)uVar2;
        iVar22 = iVar22 - uVar3;
        if (iVar22 == 0) break;
        if ((uVar9 & 1) == 0) {
          pcVar12 = 
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
          ;
          pcVar19 = "test condition failed: (f & 1) == 1";
          uVar10 = 0x15b;
          goto LAB_00116e6e;
        }
        if ((uVar15 & 1) == 0) {
          pcVar12 = 
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
          ;
          pcVar19 = "test condition failed: (g & 1) == 1";
          uVar10 = 0x15c;
          goto LAB_00116e6e;
        }
        bVar7 = 0x3e - (char)iVar22;
        if (lVar21 * uVar20 + local_148 * uVar14 != uVar9 << (bVar7 & 0x3f)) {
          pcVar12 = 
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
          ;
          pcVar19 = "test condition failed: (u * f0 + v * g0) == f << (62 - i)";
          uVar10 = 0x15d;
          goto LAB_00116e6e;
        }
        if (lVar26 * uVar20 + lVar24 * uVar14 != uVar15 << (bVar7 & 0x3f)) {
          pcVar12 = 
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
          ;
          pcVar19 = "test condition failed: (q * f0 + r * g0) == g << (62 - i)";
          uVar10 = 0x15e;
          goto LAB_00116e6e;
        }
        iVar16 = (int)uVar9;
        iVar13 = (int)uVar15;
        if (lVar18 < 0) {
          lVar18 = -lVar18;
          iVar8 = (int)lVar18 + 1;
          if (iVar22 <= iVar8) {
            iVar8 = iVar22;
          }
          if (iVar8 - 0x3fU < 0xffffffc2) {
            pcVar12 = 
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
            ;
            pcVar19 = "test condition failed: limit > 0 && limit <= 62";
            uVar10 = 0x16d;
            goto LAB_00116e6e;
          }
          uVar23 = (ulong)(uVar2 ^ (uint)((uVar15 & uVar9) >> 1));
          uVar5 = (ulong)(0x3fL << (-(char)iVar8 & 0x3fU)) >> (-(char)iVar8 & 0x3fU);
          uVar3 = (iVar13 * iVar13 + 0x3e) * iVar13 * iVar16 & (uint)uVar5;
          lVar6 = lVar26;
          uVar11 = uVar15;
          lVar17 = local_148;
        }
        else {
          iVar8 = (int)lVar18 + 1;
          if (iVar22 <= iVar8) {
            iVar8 = iVar22;
          }
          if (iVar8 - 0x3fU < 0xffffffc2) {
            pcVar12 = 
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
            ;
            pcVar19 = "test condition failed: limit > 0 && limit <= 62";
            uVar10 = 0x177;
            goto LAB_00116e6e;
          }
          uVar5 = (ulong)(0xfL << (-(char)iVar8 & 0x3fU)) >> (-(char)iVar8 & 0x3fU);
          uVar3 = -(iVar13 * ((iVar16 * 2 + 2U & 8) + iVar16)) & (uint)uVar5;
          lVar6 = lVar21;
          uVar11 = uVar9;
          uVar9 = uVar15;
          lVar17 = lVar24;
          lVar21 = lVar26;
          lVar24 = local_148;
        }
        uVar25 = (ulong)uVar3;
        uVar15 = uVar25 * uVar11 + uVar9;
        lVar26 = uVar25 * lVar6 + lVar21;
        uVar9 = uVar11;
        lVar21 = lVar24 * uVar25 + lVar17;
        local_148 = lVar24;
        if ((uVar15 & uVar5) != 0) {
          pcVar12 = 
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
          ;
          pcVar19 = "test condition failed: (g & m) == 0";
          uVar10 = 0x182;
          goto LAB_00116e6e;
        }
      }
      local_b8.u = local_148;
      local_b8.v = lVar21;
      local_b8.q = lVar24;
      local_b8.r = lVar26;
      iVar22 = secp256k1_modinv64_det_check_pow2(&local_b8,0x3e,1);
      if (iVar22 == 0) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
        ;
        pcVar19 = "test condition failed: secp256k1_modinv64_det_check_pow2(t, 62, 1)";
        uVar10 = 0x18e;
        goto LAB_00116e6e;
      }
      iVar22 = secp256k1_modinv64_mul_cmp_62(&f,iVar1,&secp256k1_const_modinfo_fe.modulus,0);
      if (iVar22 < 1) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
        ;
        pcVar19 = 
        "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0";
        uVar10 = 0x2e8;
        goto LAB_00116e6e;
      }
      lVar26 = 1;
      iVar22 = secp256k1_modinv64_mul_cmp_62(&f,iVar1,&secp256k1_const_modinfo_fe.modulus,1);
      if (0 < iVar22) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
        ;
        pcVar19 = 
        "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0";
        uVar10 = 0x2e9;
        goto LAB_00116e6e;
      }
      iVar22 = secp256k1_modinv64_mul_cmp_62(&local_110,iVar1,&secp256k1_const_modinfo_fe.modulus,0)
      ;
      if (iVar22 < 1) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
        ;
        pcVar19 = 
        "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0";
        uVar10 = 0x2ea;
        goto LAB_00116e6e;
      }
      iVar22 = secp256k1_modinv64_mul_cmp_62(&local_110,iVar1,&secp256k1_const_modinfo_fe.modulus,1)
      ;
      if (-1 < iVar22) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
        ;
        pcVar19 = 
        "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0";
        uVar10 = 0x2eb;
        goto LAB_00116e6e;
      }
      secp256k1_modinv64_update_fg_62_var(iVar1,&f,&local_110,&local_b8);
      uVar14 = f.v[0];
      lVar6 = (long)iVar1;
      if (f.v[0] == 1) {
        uVar9 = 0;
        for (; lVar26 < lVar6; lVar26 = lVar26 + 1) {
          uVar9 = uVar9 | f.v[lVar26];
        }
        if (uVar9 == 0) {
          uVar3 = ~uVar2 & 1;
          goto LAB_001168d7;
        }
      }
      if ((-1 < lVar6 + -2 && f.v[lVar6 + -1] == 0) && (&local_118)[lVar6] == 0) {
        iVar1 = iVar1 + -1;
      }
      iVar22 = secp256k1_modinv64_mul_cmp_62(&f,iVar1,&secp256k1_const_modinfo_fe.modulus,0);
      if (iVar22 < 1) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
        ;
        pcVar19 = 
        "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0";
        uVar10 = 0x302;
        goto LAB_00116e6e;
      }
      iVar22 = secp256k1_modinv64_mul_cmp_62(&f,iVar1,&secp256k1_const_modinfo_fe.modulus,1);
      if (0 < iVar22) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
        ;
        pcVar19 = 
        "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0";
        uVar10 = 0x303;
        goto LAB_00116e6e;
      }
      iVar22 = secp256k1_modinv64_mul_cmp_62(&local_110,iVar1,&secp256k1_const_modinfo_fe.modulus,0)
      ;
      if (iVar22 < 1) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
        ;
        pcVar19 = 
        "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0";
        uVar10 = 0x304;
        goto LAB_00116e6e;
      }
      iVar22 = secp256k1_modinv64_mul_cmp_62(&local_110,iVar1,&secp256k1_const_modinfo_fe.modulus,1)
      ;
      if (-1 < iVar22) {
        pcVar12 = 
        "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv64_impl.h"
        ;
        pcVar19 = 
        "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0";
        uVar10 = 0x305;
        goto LAB_00116e6e;
      }
    }
    uVar3 = secp256k1_fe_sqrt((secp256k1_fe *)&f,&sqrt);
  }
  else {
    uVar3 = 1;
  }
LAB_001168d7:
  secp256k1_fe_normalize_weak(&tmp);
  uVar2 = secp256k1_fe_sqrt(&sqrt,&tmp);
  if (uVar3 == uVar2) {
    return uVar3;
  }
  pcVar12 = 
  "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/field_impl.h";
  pcVar19 = "test condition failed: ret == secp256k1_fe_sqrt(&sqrt, &tmp)";
  uVar10 = 0x1ab;
LAB_00116e6e:
  fprintf(_stderr,"%s:%d: %s\n",pcVar12,uVar10,pcVar19);
  abort();
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_is_square_var(const secp256k1_fe *x) {
    int ret;
    secp256k1_fe tmp = *x, sqrt;
    SECP256K1_FE_VERIFY(x);

    ret = secp256k1_fe_impl_is_square_var(x);
    secp256k1_fe_normalize_weak(&tmp);
    VERIFY_CHECK(ret == secp256k1_fe_sqrt(&sqrt, &tmp));
    return ret;
}